

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O0

void __thiscall RemoveVCProcessTest::SetUp(RemoveVCProcessTest *this)

{
  bool bVar1;
  RemoveVCProcess *this_00;
  aiScene *this_01;
  aiMesh **ppaVar2;
  aiMesh *paVar3;
  aiVector3D *paVar4;
  aiAnimation **ppaVar5;
  aiAnimation *paVar6;
  aiTexture **ppaVar7;
  aiTexture *paVar8;
  aiMaterial **ppaVar9;
  aiMaterial *paVar10;
  aiLight **ppaVar11;
  aiLight *paVar12;
  aiCamera **ppaVar13;
  aiCamera *paVar14;
  char *message;
  aiVector3t<float> *local_140;
  aiVector3t<float> *local_120;
  aiVector3t<float> *local_100;
  aiVector3t<float> *local_e0;
  aiVector3t<float> *local_c0;
  aiVector3t<float> *local_a0;
  aiVector3t<float> *local_70;
  AssertHelper local_50;
  Message local_48;
  char local_3c [4];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  char check [10];
  RemoveVCProcessTest *this_local;
  
  this_00 = (RemoveVCProcess *)operator_new(0x28);
  Assimp::RemoveVCProcess::RemoveVCProcess(this_00);
  this->piProcess = this_00;
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->pScene = this_01;
  this->pScene->mNumMeshes = 2;
  ppaVar2 = (aiMesh **)operator_new__(0x10);
  this->pScene->mMeshes = ppaVar2;
  paVar3 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(paVar3);
  *this->pScene->mMeshes = paVar3;
  paVar3 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(paVar3);
  this->pScene->mMeshes[1] = paVar3;
  (*this->pScene->mMeshes)->mNumVertices = 0x78;
  paVar4 = (aiVector3D *)operator_new__(0x5a0);
  local_70 = paVar4;
  do {
    aiVector3t<float>::aiVector3t(local_70);
    local_70 = local_70 + 1;
  } while (local_70 != paVar4 + 0x78);
  (*this->pScene->mMeshes)->mVertices = paVar4;
  paVar4 = (aiVector3D *)operator_new__(0x5a0);
  local_a0 = paVar4;
  do {
    aiVector3t<float>::aiVector3t(local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != paVar4 + 0x78);
  (*this->pScene->mMeshes)->mNormals = paVar4;
  paVar4 = (aiVector3D *)operator_new__(0x5a0);
  local_c0 = paVar4;
  do {
    aiVector3t<float>::aiVector3t(local_c0);
    local_c0 = local_c0 + 1;
  } while (local_c0 != paVar4 + 0x78);
  (*this->pScene->mMeshes)->mTextureCoords[0] = paVar4;
  paVar4 = (aiVector3D *)operator_new__(0x5a0);
  local_e0 = paVar4;
  do {
    aiVector3t<float>::aiVector3t(local_e0);
    local_e0 = local_e0 + 1;
  } while (local_e0 != paVar4 + 0x78);
  (*this->pScene->mMeshes)->mTextureCoords[1] = paVar4;
  paVar4 = (aiVector3D *)operator_new__(0x5a0);
  local_100 = paVar4;
  do {
    aiVector3t<float>::aiVector3t(local_100);
    local_100 = local_100 + 1;
  } while (local_100 != paVar4 + 0x78);
  (*this->pScene->mMeshes)->mTextureCoords[2] = paVar4;
  paVar4 = (aiVector3D *)operator_new__(0x5a0);
  local_120 = paVar4;
  do {
    aiVector3t<float>::aiVector3t(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != paVar4 + 0x78);
  (*this->pScene->mMeshes)->mTextureCoords[3] = paVar4;
  this->pScene->mMeshes[1]->mNumVertices = 0x78;
  paVar4 = (aiVector3D *)operator_new__(0x5a0);
  local_140 = paVar4;
  do {
    aiVector3t<float>::aiVector3t(local_140);
    local_140 = local_140 + 1;
  } while (local_140 != paVar4 + 0x78);
  this->pScene->mMeshes[1]->mVertices = paVar4;
  this->pScene->mNumAnimations = 2;
  ppaVar5 = (aiAnimation **)operator_new__(0x10);
  this->pScene->mAnimations = ppaVar5;
  paVar6 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(paVar6);
  *this->pScene->mAnimations = paVar6;
  paVar6 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(paVar6);
  this->pScene->mAnimations[1] = paVar6;
  this->pScene->mNumTextures = 2;
  ppaVar7 = (aiTexture **)operator_new__(0x10);
  this->pScene->mTextures = ppaVar7;
  paVar8 = (aiTexture *)operator_new(0x428);
  aiTexture::aiTexture(paVar8);
  *this->pScene->mTextures = paVar8;
  paVar8 = (aiTexture *)operator_new(0x428);
  aiTexture::aiTexture(paVar8);
  this->pScene->mTextures[1] = paVar8;
  this->pScene->mNumMaterials = 2;
  ppaVar9 = (aiMaterial **)operator_new__(0x10);
  this->pScene->mMaterials = ppaVar9;
  paVar10 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar10);
  *this->pScene->mMaterials = paVar10;
  paVar10 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar10);
  this->pScene->mMaterials[1] = paVar10;
  this->pScene->mNumLights = 2;
  ppaVar11 = (aiLight **)operator_new__(0x10);
  this->pScene->mLights = ppaVar11;
  paVar12 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(paVar12);
  *this->pScene->mLights = paVar12;
  paVar12 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(paVar12);
  this->pScene->mLights[1] = paVar12;
  this->pScene->mNumCameras = 2;
  ppaVar13 = (aiCamera **)operator_new__(0x10);
  this->pScene->mCameras = ppaVar13;
  paVar14 = (aiCamera *)operator_new(0x438);
  aiCamera::aiCamera(paVar14);
  *this->pScene->mCameras = paVar14;
  paVar14 = (aiCamera *)operator_new(0x438);
  aiCamera::aiCamera(paVar14);
  this->pScene->mCameras[1] = paVar14;
  gtest_ar.message_.ptr_._2_1_ = 0;
  local_3c[0] = '\0';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  testing::internal::EqHelper<true>::Compare<int,char>
            ((char *)local_38,"0",(int *)"check[0]",local_3c,
             (type *)((long)&gtest_ar.message_.ptr_ + 2));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

void RemoveVCProcessTest::SetUp()
{
    // construct the process
    piProcess = new RemoveVCProcess();
    pScene = new aiScene();

    // fill the scene ..
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes = 2];
    pScene->mMeshes[0] = new aiMesh();
    pScene->mMeshes[1] = new aiMesh();

    pScene->mMeshes[0]->mNumVertices = 120;
    pScene->mMeshes[0]->mVertices = new aiVector3D[120];
    pScene->mMeshes[0]->mNormals = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[0] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[1] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[2] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[3] = new aiVector3D[120];

    pScene->mMeshes[1]->mNumVertices = 120;
    pScene->mMeshes[1]->mVertices = new aiVector3D[120];

    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations = 2];
    pScene->mAnimations[0] = new aiAnimation();
    pScene->mAnimations[1] = new aiAnimation();

    pScene->mTextures = new aiTexture*[pScene->mNumTextures = 2];
    pScene->mTextures[0] = new aiTexture();
    pScene->mTextures[1] = new aiTexture();

    pScene->mMaterials    = new aiMaterial*[pScene->mNumMaterials = 2];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mMaterials[1] = new aiMaterial();

    pScene->mLights    = new aiLight*[pScene->mNumLights = 2];
    pScene->mLights[0] = new aiLight();
    pScene->mLights[1] = new aiLight();

    pScene->mCameras    = new aiCamera*[pScene->mNumCameras = 2];
    pScene->mCameras[0] = new aiCamera();
    pScene->mCameras[1] = new aiCamera();

    // COMPILE TEST: aiMaterial may no add any extra members,
    // so we don't need a virtual destructor
    char check[sizeof(aiMaterial) == sizeof(aiMaterial) ? 10 : -1];
    check[0] = 0;
    // to remove compiler warning
    EXPECT_EQ( 0, check[0] );
}